

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O0

shared_ptr<duckdb::RowVersionManager,_true>
duckdb::RowVersionManager::Deserialize
          (MetaBlockPointer delete_pointer,MetadataManager *manager,idx_t start)

{
  optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true> read_pointers_p;
  bool bVar1;
  RowVersionManager *pRVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  RowVersionManager *this;
  unsigned_long in_RCX;
  undefined8 in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  idx_t in_RSI;
  MetadataManager *in_RDI;
  shared_ptr<duckdb::RowVersionManager,_true> sVar7;
  idx_t vector_index;
  idx_t i;
  unsigned_long chunk_count;
  MetadataReader source;
  shared_ptr<duckdb::RowVersionManager,_true> *version_info;
  unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>
  *in_stack_fffffffffffffe88;
  MetadataReader *in_stack_fffffffffffffe90;
  RowVersionManager *in_stack_fffffffffffffe98;
  unsigned_long *in_stack_fffffffffffffeb8;
  unsigned_long params_1;
  MetadataManager *manager_00;
  MetadataReader *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  allocator in_stack_fffffffffffffef7;
  MetaBlockPointer in_stack_fffffffffffffef8;
  ulong local_e0;
  optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true> local_c0;
  idx_t local_b8;
  uint32_t uStack_b0;
  uint32_t uStack_ac;
  byte local_29;
  unsigned_long local_20;
  MetaBlockPointer local_18;
  
  manager_00 = in_RDI;
  local_20 = in_RCX;
  local_18.block_pointer = in_RSI;
  local_18._8_8_ = in_RDX;
  bVar1 = MetaBlockPointer::IsValid(&local_18);
  if (bVar1) {
    local_29 = 0;
    make_shared_ptr<duckdb::RowVersionManager,unsigned_long&>(in_stack_fffffffffffffeb8);
    local_b8 = local_18.block_pointer;
    uStack_b0 = local_18.offset;
    uStack_ac = local_18.unused_padding;
    pRVar2 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                       ((shared_ptr<duckdb::RowVersionManager,_true> *)in_stack_fffffffffffffe90);
    optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>::optional_ptr
              (&local_c0,&pRVar2->storage_pointers);
    read_pointers_p.ptr._6_1_ = in_stack_fffffffffffffef6;
    read_pointers_p.ptr._0_6_ = in_stack_fffffffffffffef0;
    read_pointers_p.ptr._7_1_ = in_stack_fffffffffffffef7;
    MetadataReader::MetadataReader
              (in_stack_fffffffffffffee8,manager_00,in_stack_fffffffffffffef8,read_pointers_p,
               (BlockReaderType)((ulong)in_RDI >> 0x20));
    uVar3 = ReadStream::Read<unsigned_long>(&in_stack_fffffffffffffe90->super_ReadStream);
    params_1 = local_20;
    for (local_e0 = 0; local_e0 < uVar3; local_e0 = local_e0 + 1) {
      uVar4 = ReadStream::Read<unsigned_long>(&in_stack_fffffffffffffe90->super_ReadStream);
      if (0x3fffffff < uVar4 << 0xb) {
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffef8,
                   "In DeserializeDeletes, vector_index %llu is out of range for the max row group size of %llu. Corrupted file?"
                   ,(allocator *)&stack0xfffffffffffffef7);
        IOException::IOException<unsigned_long,unsigned_long>
                  ((IOException *)manager_00,(string *)in_RDI,(unsigned_long)pRVar2,params_1);
        __cxa_throw(uVar5,&IOException::typeinfo,IOException::~IOException);
      }
      this = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                       ((shared_ptr<duckdb::RowVersionManager,_true> *)in_stack_fffffffffffffe90);
      FillVectorInfo(this,(idx_t)in_stack_fffffffffffffe98);
      ChunkInfo::Read(&in_stack_fffffffffffffee8->super_ReadStream);
      in_stack_fffffffffffffe98 =
           shared_ptr<duckdb::RowVersionManager,_true>::operator->
                     ((shared_ptr<duckdb::RowVersionManager,_true> *)in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe90 =
           (MetadataReader *)
           vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                         *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::operator=
                ((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> *)
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::~unique_ptr
                ((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> *)
                 0xba927e);
    }
    pRVar2 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                       ((shared_ptr<duckdb::RowVersionManager,_true> *)in_stack_fffffffffffffe90);
    pRVar2->has_changes = false;
    local_29 = 1;
    MetadataReader::~MetadataReader(in_stack_fffffffffffffe90);
    _Var6._M_pi = extraout_RDX_00;
    if ((local_29 & 1) == 0) {
      shared_ptr<duckdb::RowVersionManager,_true>::~shared_ptr
                ((shared_ptr<duckdb::RowVersionManager,_true> *)0xba9309);
      _Var6._M_pi = extraout_RDX_01;
    }
  }
  else {
    shared_ptr<duckdb::RowVersionManager,_true>::shared_ptr
              ((shared_ptr<duckdb::RowVersionManager,_true> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    _Var6._M_pi = extraout_RDX;
  }
  sVar7.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)manager_00;
  return (shared_ptr<duckdb::RowVersionManager,_true>)
         sVar7.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowVersionManager> RowVersionManager::Deserialize(MetaBlockPointer delete_pointer, MetadataManager &manager,
                                                             idx_t start) {
	if (!delete_pointer.IsValid()) {
		return nullptr;
	}
	auto version_info = make_shared_ptr<RowVersionManager>(start);
	MetadataReader source(manager, delete_pointer, &version_info->storage_pointers);
	auto chunk_count = source.Read<idx_t>();
	D_ASSERT(chunk_count > 0);
	for (idx_t i = 0; i < chunk_count; i++) {
		idx_t vector_index = source.Read<idx_t>();
		if (vector_index * STANDARD_VECTOR_SIZE >= Storage::MAX_ROW_GROUP_SIZE) {
			throw IOException("In DeserializeDeletes, vector_index %llu is out of range for the max row group size of "
			                  "%llu. Corrupted file?",
			                  vector_index, Storage::MAX_ROW_GROUP_SIZE);
		}

		version_info->FillVectorInfo(vector_index);
		version_info->vector_info[vector_index] = ChunkInfo::Read(source);
	}
	version_info->has_changes = false;
	return version_info;
}